

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedralBuilder.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  long *plVar3;
  void *pvVar4;
  ulong uVar5;
  size_type sVar6;
  double *pdVar7;
  double *pdVar8;
  string *filename;
  Mat3x3d *m;
  SnapshotManager *this;
  undefined8 uVar9;
  double dVar10;
  Icosahedron *in_stack_00000140;
  Mat3x3d boundingBox;
  int i;
  Vector3d orientation;
  Vector3d location;
  uint n;
  Vector3d boxMin;
  Vector3d boxMax;
  int l;
  MoleculeIterator mi;
  Molecule *mol;
  SimInfo *NewInfo;
  SimCreator newCreator;
  RegularCuboctahedron *rc;
  TruncatedCube *tc;
  int truncatedPlanes_1;
  int unitCells;
  string lattice;
  CurlingStoneDecahedron *csd;
  int truncatedPlanes;
  int twinAtoms_1;
  int columnAtoms_2;
  Decahedron *marks;
  int twinAtoms;
  int columnAtoms_1;
  InoDecahedron *ino;
  int columnAtoms;
  RegularDecahedron *deca;
  Icosahedron *ico;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> Points;
  SimInfo *oldInfo;
  SimCreator oldCreator;
  DumpWriter *writer;
  int nShells;
  RealType latticeConstant;
  MoLocator *locator;
  string outputFileName;
  string inputFileName;
  gengetopt_args_info args_info;
  int in_stack_0000fd84;
  string *in_stack_0000fd88;
  string *in_stack_0000fd90;
  undefined1 in_stack_00010377;
  string *in_stack_00010378;
  SimCreator *in_stack_00010380;
  int in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  SimInfo *in_stack_fffffffffffff950;
  errorStruct *peVar11;
  Vector<double,_3U> *in_stack_fffffffffffff958;
  errorStruct *in_stack_fffffffffffff960;
  MoleculeStamp *in_stack_fffffffffffff968;
  SimInfo *in_stack_fffffffffffff970;
  Icosahedron *in_stack_fffffffffffff978;
  undefined8 in_stack_fffffffffffff980;
  string *in_stack_fffffffffffff988;
  TruncatedCube *in_stack_fffffffffffff990;
  Snapshot *this_00;
  SimInfo *in_stack_fffffffffffff9f8;
  DumpWriter *in_stack_fffffffffffffa00;
  Molecule *in_stack_fffffffffffffac8;
  Decahedron *in_stack_fffffffffffffad0;
  Vector3d *in_stack_fffffffffffffad8;
  MoLocator *this_01;
  RectMatrix<double,_3U,_3U> local_4e8;
  uint local_49c;
  Vector<double,_3U> local_438;
  uint local_41c;
  Vector<double,_3U> local_418;
  Vector<double,_3U> local_400;
  int local_3e4;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_3e0;
  Molecule *local_3d8;
  SimInfo *local_3d0;
  undefined1 local_3a0 [31];
  undefined1 local_381;
  string local_380 [32];
  long *local_360;
  undefined1 local_358 [31];
  undefined1 local_339;
  string local_338 [32];
  long *local_318;
  undefined4 local_310;
  undefined4 local_30c;
  string local_308 [32];
  undefined1 local_2e8 [24];
  long *local_2d0;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined1 local_2b8 [24];
  long *local_2a0;
  undefined4 local_298;
  undefined4 local_294;
  undefined1 local_290 [24];
  Molecule *local_278;
  undefined4 local_26c;
  undefined1 local_268 [24];
  Decahedron *local_250;
  Vector3d *local_230;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_228;
  SimInfo *local_210;
  MoLocator local_208;
  void *local_1d0;
  int local_1c4;
  undefined8 local_1c0;
  void *local_1b8;
  string local_1b0 [32];
  string local_190 [48];
  char *local_160;
  int local_148;
  undefined8 local_130;
  char *local_118;
  undefined4 local_100;
  undefined4 local_e8;
  undefined4 local_d0;
  undefined4 local_b8;
  int local_5c;
  int local_58;
  int local_54;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  undefined8 *local_20;
  int local_18;
  int local_4;
  
  local_4 = 0;
  std::__cxx11::string::string(local_190);
  std::__cxx11::string::string(local_1b0);
  local_1c0 = 0;
  local_1c4 = -1;
  iVar2 = cmdline_parser((int)((ulong)in_stack_fffffffffffff950 >> 0x20),
                         (char **)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         (gengetopt_args_info *)0x11b5ae);
  if (iVar2 == 0) {
    if (local_18 == 0) {
      snprintf(painCave.errMsg,2000,"No input .omd file name was specified on the command line");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
    else {
      std::__cxx11::string::operator=(local_190,(char *)*local_20);
    }
    if (((local_5c == 0) && (local_2c == 0)) && (local_28 == 0)) {
      snprintf(painCave.errMsg,2000,
               "icosahedralBuilder:  The number of shells\n\tis required to build a Mackay Icosahedron."
              );
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
    else {
      local_1c4 = local_148;
      if (local_148 < 0) {
        snprintf(painCave.errMsg,2000,
                 "icosahedralBuilder:  The number of shells\n\tmust be greater than or equal to zero."
                );
        painCave.isFatal = 1;
        cmdline_parser_print_help();
        simError();
      }
    }
    if (local_58 == 0) {
      snprintf(painCave.errMsg,2000,"icosahedralBuilder:  No lattice constant\n\tgiven.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
    else {
      local_1c0 = local_130;
    }
    this_01 = &local_208;
    OpenMD::SimCreator::SimCreator((SimCreator *)0x11b787);
    local_210 = OpenMD::SimCreator::createSim
                          (in_stack_00010380,in_stack_00010378,(bool)in_stack_00010377);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               0x11b7c5);
    if (local_40 == 0) {
      if (local_3c == 0) {
        if (local_38 == 0) {
          if (local_34 == 0) {
            if (local_30 == 0) {
              if ((local_2c != 0) || (local_28 != 0)) {
                std::__cxx11::string::string(local_308);
                local_30c = 0;
                if (local_54 == 0) {
                  snprintf(painCave.errMsg,2000,"icosahedralBuilder: No lattice type given.");
                  painCave.isFatal = 1;
                  cmdline_parser_print_help();
                  simError();
                }
                else {
                  std::__cxx11::string::operator=(local_308,local_118);
                }
                if (local_44 == 0) {
                  snprintf(painCave.errMsg,2000,"icosahedralBuilder: Must specify unit cells.");
                  painCave.isFatal = 1;
                  cmdline_parser_print_help();
                  simError();
                }
                else {
                  local_30c = local_b8;
                }
                if (local_28 == 0) {
                  plVar3 = (long *)operator_new(0x60);
                  iVar2 = (int)((ulong)in_stack_fffffffffffff980 >> 0x20);
                  local_381 = 1;
                  std::__cxx11::string::string(local_380,local_308);
                  OpenMD::RegularCuboctahedron::RegularCuboctahedron
                            ((RegularCuboctahedron *)in_stack_fffffffffffff990,
                             in_stack_fffffffffffff988,iVar2);
                  local_381 = 0;
                  std::__cxx11::string::~string(local_380);
                  local_360 = plVar3;
                  (**(code **)(*plVar3 + 0x10))(local_3a0);
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  operator=((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             *)in_stack_fffffffffffff960,
                            (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             *)in_stack_fffffffffffff958);
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  ~vector((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)in_stack_fffffffffffff960);
                }
                else {
                  local_310 = local_d0;
                  plVar3 = (long *)operator_new(0x60);
                  local_339 = 1;
                  std::__cxx11::string::string(local_338,local_308);
                  OpenMD::TruncatedCube::TruncatedCube
                            (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                             (int)((ulong)in_stack_fffffffffffff980 >> 0x20),
                             (int)in_stack_fffffffffffff980);
                  local_339 = 0;
                  std::__cxx11::string::~string(local_338);
                  local_318 = plVar3;
                  (**(code **)(*plVar3 + 0x10))(local_358);
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  operator=((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             *)in_stack_fffffffffffff960,
                            (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             *)in_stack_fffffffffffff958);
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  ~vector((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)in_stack_fffffffffffff960);
                }
                std::__cxx11::string::~string(local_308);
              }
            }
            else {
              local_2bc = local_100;
              local_2c0 = local_e8;
              local_2c4 = local_d0;
              plVar3 = (long *)operator_new(0x50);
              OpenMD::CurlingStoneDecahedron::CurlingStoneDecahedron
                        ((CurlingStoneDecahedron *)in_stack_fffffffffffff960,
                         (int)((ulong)in_stack_fffffffffffff958 >> 0x20),
                         (int)in_stack_fffffffffffff958,
                         (int)((ulong)in_stack_fffffffffffff950 >> 0x20),
                         (int)in_stack_fffffffffffff950);
              local_2d0 = plVar3;
              (**(code **)(*plVar3 + 0x10))(local_2e8);
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              operator=((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)in_stack_fffffffffffff960,
                        (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)in_stack_fffffffffffff958);
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              ~vector((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                      in_stack_fffffffffffff960);
            }
          }
          else {
            local_294 = local_100;
            local_298 = local_e8;
            plVar3 = (long *)operator_new(0x48);
            OpenMD::Decahedron::Decahedron
                      (in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20),
                       (int)in_stack_fffffffffffffac8,(int)((ulong)plVar3 >> 0x20));
            local_2a0 = plVar3;
            (**(code **)(*plVar3 + 0x10))(local_2b8);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator=((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                      in_stack_fffffffffffff960,
                      (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                      in_stack_fffffffffffff958);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
                      ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )in_stack_fffffffffffff960);
          }
        }
        else {
          local_26c = local_100;
          in_stack_fffffffffffffac8 = (Molecule *)operator_new(0x48);
          OpenMD::InoDecahedron::InoDecahedron
                    ((InoDecahedron *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                     in_stack_fffffffffffff948);
          local_278 = in_stack_fffffffffffffac8;
          (*in_stack_fffffffffffffac8->_vptr_Molecule[2])(local_290);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_fffffffffffff960,
                     (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_fffffffffffff958);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_fffffffffffff960);
        }
      }
      else {
        in_stack_fffffffffffffad0 = (Decahedron *)operator_new(0x48);
        OpenMD::RegularDecahedron::RegularDecahedron
                  ((RegularDecahedron *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
        local_250 = in_stack_fffffffffffffad0;
        (*in_stack_fffffffffffffad0->_vptr_Decahedron[2])(local_268);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   in_stack_fffffffffffff960,
                   (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   in_stack_fffffffffffff958);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   in_stack_fffffffffffff960);
      }
    }
    else {
      in_stack_fffffffffffffad8 = (Vector3d *)operator_new(0x68);
      OpenMD::Icosahedron::Icosahedron(in_stack_00000140);
      local_230 = in_stack_fffffffffffffad8;
      OpenMD::Icosahedron::getPoints
                (in_stack_fffffffffffff978,(int)((ulong)in_stack_fffffffffffff970 >> 0x20));
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffff960,
                 (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffff958);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffff960);
    }
    std::__cxx11::string::operator=(local_1b0,local_160);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
              (&local_228);
    createMdFile(in_stack_0000fd90,in_stack_0000fd88,in_stack_0000fd84);
    if (local_210 != (SimInfo *)0x0) {
      (*local_210->_vptr_SimInfo[1])();
    }
    OpenMD::SimCreator::SimCreator((SimCreator *)0x11bfeb);
    local_3d0 = OpenMD::SimCreator::createSim
                          (in_stack_00010380,in_stack_00010378,(bool)in_stack_00010377);
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_3e0)
    ;
    local_3d8 = OpenMD::SimInfo::beginMolecule
                          (in_stack_fffffffffffff970,(MoleculeIterator *)in_stack_fffffffffffff968);
    local_3e4 = 0;
    pvVar4 = operator_new(0x30);
    OpenMD::SimInfo::getMoleculeStamp(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
    OpenMD::SimInfo::getForceField(local_3d0);
    OpenMD::MoLocator::MoLocator
              ((MoLocator *)in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               (ForceField *)in_stack_fffffffffffff960);
    local_1b8 = pvVar4;
    OpenMD::Vector3<double>::Vector3((Vector3<double> *)0x11c0eb);
    OpenMD::Vector3<double>::Vector3((Vector3<double> *)0x11c0fa);
    for (local_41c = 0; uVar5 = (ulong)local_41c,
        sVar6 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                size(&local_228), uVar5 < sVar6; local_41c = local_41c + 1) {
      local_3d8 = OpenMD::SimInfo::getMoleculeByGlobalIndex
                            (in_stack_fffffffffffff970,
                             (int)((ulong)in_stack_fffffffffffff968 >> 0x20));
      OpenMD::Vector3<double>::Vector3((Vector3<double> *)0x11c172);
      if ((local_2c == 0) && (local_28 == 0)) {
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (&local_228,(ulong)local_41c);
        OpenMD::operator*(in_stack_fffffffffffff958,(double)in_stack_fffffffffffff950);
        sqrt(2.0);
        OpenMD::operator/(in_stack_fffffffffffff958,(double)in_stack_fffffffffffff950);
        OpenMD::Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff958,
                   (Vector<double,_3U> *)in_stack_fffffffffffff950);
      }
      else {
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (&local_228,(ulong)local_41c);
        OpenMD::operator*(in_stack_fffffffffffff958,(double)in_stack_fffffffffffff950);
        OpenMD::Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff958,
                   (Vector<double,_3U> *)in_stack_fffffffffffff950);
      }
      OpenMD::Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_fffffffffffff960,(double)in_stack_fffffffffffff958,
                 (double)in_stack_fffffffffffff950,
                 (double)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
      if (local_41c == 0) {
        OpenMD::Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff950,
                   (Vector3<double> *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948))
        ;
        OpenMD::Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff950,
                   (Vector3<double> *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948))
        ;
      }
      else {
        for (local_49c = 0; (int)local_49c < 3; local_49c = local_49c + 1) {
          pdVar7 = OpenMD::Vector<double,_3U>::operator[](&local_400,local_49c);
          pdVar8 = OpenMD::Vector<double,_3U>::operator[](&local_438,local_49c);
          pdVar7 = std::max<double>(pdVar7,pdVar8);
          dVar10 = *pdVar7;
          pdVar7 = OpenMD::Vector<double,_3U>::operator[](&local_400,local_49c);
          *pdVar7 = dVar10;
          pdVar7 = OpenMD::Vector<double,_3U>::operator[](&local_418,local_49c);
          pdVar8 = OpenMD::Vector<double,_3U>::operator[](&local_438,local_49c);
          pdVar7 = std::min<double>(pdVar7,pdVar8);
          in_stack_fffffffffffff9f8 = (SimInfo *)*pdVar7;
          in_stack_fffffffffffffa00 =
               (DumpWriter *)OpenMD::Vector<double,_3U>::operator[](&local_418,local_49c);
          in_stack_fffffffffffffa00->info_ = in_stack_fffffffffffff9f8;
        }
      }
      OpenMD::MoLocator::placeMol
                (this_01,in_stack_fffffffffffffad8,(Vector3d *)in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8);
      local_3e4 = local_3e4 + 1;
    }
    OpenMD::SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x11c4b7);
    filename = (string *)OpenMD::Vector<double,_3U>::operator[](&local_400,0);
    this_00 = *(Snapshot **)filename;
    pdVar7 = OpenMD::Vector<double,_3U>::operator[](&local_418,0);
    dVar10 = (double)this_00 - *pdVar7;
    m = (Mat3x3d *)OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_4e8,0,0);
    (m->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] = dVar10 * 10.0;
    pdVar7 = OpenMD::Vector<double,_3U>::operator[](&local_400,1);
    dVar10 = *pdVar7;
    pdVar7 = OpenMD::Vector<double,_3U>::operator[](&local_418,1);
    dVar1 = *pdVar7;
    pdVar7 = OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_4e8,1,1);
    *pdVar7 = (dVar10 - dVar1) * 10.0;
    pdVar7 = OpenMD::Vector<double,_3U>::operator[](&local_400,2);
    dVar10 = *pdVar7;
    pdVar7 = OpenMD::Vector<double,_3U>::operator[](&local_418,2);
    dVar10 = (dVar10 - *pdVar7) * 10.0;
    pdVar7 = OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_4e8,2,2);
    *pdVar7 = dVar10;
    this = OpenMD::SimInfo::getSnapshotManager(local_3d0);
    OpenMD::SnapshotManager::getCurrentSnapshot(this);
    OpenMD::Snapshot::setHmat(this_00,m);
    pvVar4 = operator_new(0x60);
    OpenMD::DumpWriter::DumpWriter(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,filename);
    local_1d0 = pvVar4;
    if (pvVar4 == (void *)0x0) {
      in_stack_fffffffffffff960 = &painCave;
      snprintf(painCave.errMsg,2000,"Error in creating dumpwriter object ");
      (((ForceField *)in_stack_fffffffffffff960)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.optional_ = true;
      (((ForceField *)in_stack_fffffffffffff960)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.defaultValue_ = false;
      (((ForceField *)in_stack_fffffffffffff960)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.empty_ = false;
      (((ForceField *)in_stack_fffffffffffff960)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.field_0x2b = 0;
      simError();
    }
    OpenMD::DumpWriter::writeDump((DumpWriter *)0x11c787);
    if (local_1d0 != (void *)0x0) {
      pvVar4 = local_1d0;
      OpenMD::DumpWriter::~DumpWriter((DumpWriter *)in_stack_fffffffffffff950);
      operator_delete(pvVar4,0x60);
    }
    uVar9 = std::__cxx11::string::c_str();
    peVar11 = &painCave;
    snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",uVar9);
    peVar11->isFatal = 0;
    peVar11->severity = 3;
    simError();
    local_4 = 0;
    OpenMD::SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x11c81c);
    OpenMD::SimCreator::~SimCreator((SimCreator *)0x11c829);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffff960);
    OpenMD::SimCreator::~SimCreator((SimCreator *)0x11c843);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string(local_190);
    return local_4;
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;
  std::string inputFileName;
  std::string outputFileName;

  MoLocator* locator;
  RealType latticeConstant(0.0);
  int nShells(-1);

  DumpWriter* writer;

  // Parse Command Line Arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  /* get input file name */
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input .omd file name was specified "
             "on the command line");
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }

  if (args_info.shells_given ||
      (args_info.cuboctahedron_given || args_info.truncatedCube_given)) {
    nShells = args_info.shells_arg;
    if (nShells < 0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "icosahedralBuilder:  The number of shells\n"
               "\tmust be greater than or equal to zero.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
  } else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "icosahedralBuilder:  The number of shells\n"
             "\tis required to build a Mackay Icosahedron.");
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }

  if (args_info.latticeConstant_given) {
    latticeConstant = args_info.latticeConstant_arg;
  } else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "icosahedralBuilder:  No lattice constant\n"
             "\tgiven.");
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }

  /* parse md file and set up the system */
  SimCreator oldCreator;
  SimInfo* oldInfo = oldCreator.createSim(inputFileName, false);

  vector<Vector3d> Points;
  if (args_info.ico_given) {
    Icosahedron* ico = new Icosahedron();
    Points           = ico->getPoints(nShells);
  } else if (args_info.deca_given) {
    RegularDecahedron* deca = new RegularDecahedron(nShells);
    Points                  = deca->getPoints();
  } else if (args_info.ino_given) {
    int columnAtoms    = args_info.columnAtoms_arg;
    InoDecahedron* ino = new InoDecahedron(columnAtoms, nShells);
    Points             = ino->getPoints();
  } else if (args_info.marks_given) {
    int columnAtoms   = args_info.columnAtoms_arg;
    int twinAtoms     = args_info.twinAtoms_arg;
    Decahedron* marks = new Decahedron(columnAtoms, nShells, twinAtoms);
    Points            = marks->getPoints();
  } else if (args_info.stone_given) {
    int columnAtoms             = args_info.columnAtoms_arg;
    int twinAtoms               = args_info.twinAtoms_arg;
    int truncatedPlanes         = args_info.truncatedPlanes_arg;
    CurlingStoneDecahedron* csd = new CurlingStoneDecahedron(
        columnAtoms, nShells, twinAtoms, truncatedPlanes);
    Points = csd->getPoints();
  } else if (args_info.cuboctahedron_given || args_info.truncatedCube_given) {
    std::string lattice;
    int unitCells = 0;
    if (args_info.lattice_given) {
      lattice = args_info.lattice_arg;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "icosahedralBuilder: No lattice type given.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
    if (args_info.unitCells_given) {
      unitCells = args_info.unitCells_arg;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "icosahedralBuilder: Must specify unit cells.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
    if (args_info.truncatedCube_given) {
      int truncatedPlanes = args_info.truncatedPlanes_arg;
      TruncatedCube* tc =
          new TruncatedCube(lattice, unitCells, truncatedPlanes);
      Points = tc->getPoints();
    } else {
      RegularCuboctahedron* rc = new RegularCuboctahedron(lattice, unitCells);
      Points                   = rc->getPoints();
    }
  }

  outputFileName = args_info.output_arg;

  // create a new .omd file on fly which corrects the number of
  // molecules

  createMdFile(inputFileName, outputFileName, Points.size());

  delete oldInfo;

  SimCreator newCreator;
  SimInfo* NewInfo = newCreator.createSim(outputFileName, false);

  // Place molecules
  Molecule* mol;
  SimInfo::MoleculeIterator mi;
  mol = NewInfo->beginMolecule(mi);

  int l = 0;

  locator =
      new MoLocator(NewInfo->getMoleculeStamp(0), NewInfo->getForceField());

  Vector3d boxMax;
  Vector3d boxMin;

  for (unsigned int n = 0; n < Points.size(); n++) {
    mol = NewInfo->getMoleculeByGlobalIndex(l);

    Vector3d location;
    if (args_info.cuboctahedron_given || args_info.truncatedCube_given) {
      // The cubic structures are built with a unit spacing between cells
      location = Points[n] * latticeConstant;
    } else {
      // The polyhedra are built with a unit spacing between atoms,
      // which in an FCC lattice should be multiplied by a / sqrt(2).
      location = Points[n] * latticeConstant / sqrt(2.0);
    }
    Vector3d orientation = Vector3d(0, 0, 1.0);

    if (n == 0) {
      boxMax = location;
      boxMin = location;
    } else {
      for (int i = 0; i < 3; i++) {
        boxMax[i] = max(boxMax[i], location[i]);
        boxMin[i] = min(boxMin[i], location[i]);
      }
    }

    locator->placeMol(location, orientation, mol);
    l++;
  }

  Mat3x3d boundingBox;
  boundingBox(0, 0) = 10.0 * (boxMax[0] - boxMin[0]);
  boundingBox(1, 1) = 10.0 * (boxMax[1] - boxMin[1]);
  boundingBox(2, 2) = 10.0 * (boxMax[2] - boxMin[2]);

  // set Hmat
  NewInfo->getSnapshotManager()->getCurrentSnapshot()->setHmat(boundingBox);

  // create dumpwriter and write out the coordinates
  writer = new DumpWriter(NewInfo, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Error in creating dumpwriter object ");
    painCave.isFatal = 1;
    simError();
  }

  writer->writeDump();

  // deleting the writer will put the closing at the end of the dump file

  delete writer;

  // clean up by calling simError.....
  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been "
           "generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}